

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvolutionFilter.cpp
# Opt level: O3

bool __thiscall
Rml::ConvolutionFilter::Initialise
          (ConvolutionFilter *this,Vector2i _kernel_radii,FilterOperation _operation)

{
  Vector2i VVar1;
  float *pfVar2;
  code *pcVar3;
  bool bVar4;
  float *__s;
  int iVar5;
  ulong __n;
  
  if (((ulong)_kernel_radii & 0x8000000080000000) == 0) {
    VVar1 = (Vector2i)((long)_kernel_radii * 2 + 0x100000001);
    this->kernel_size = VVar1;
    iVar5 = VVar1.y * VVar1.x;
    __n = 0xffffffffffffffff;
    if (-1 < iVar5) {
      __n = (long)iVar5 * 4;
    }
    __s = (float *)operator_new__(__n);
    memset(__s,0,__n);
    pfVar2 = (this->kernel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
    (this->kernel)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl = __s;
    if (pfVar2 != (float *)0x0) {
      operator_delete__(pfVar2);
    }
    this->operation = _operation;
  }
  else {
    bVar4 = Assert("Invalid input parameters to convolution filter.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ConvolutionFilter.cpp"
                   ,0x31);
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
  }
  return ((ulong)_kernel_radii & 0x8000000080000000) == 0;
}

Assistant:

bool ConvolutionFilter::Initialise(Vector2i _kernel_radii, FilterOperation _operation)
{
	if (_kernel_radii.x < 0 || _kernel_radii.y < 0)
	{
		RMLUI_ERRORMSG("Invalid input parameters to convolution filter.");
		return false;
	}

	kernel_size = _kernel_radii * 2 + Vector2i(1);

	kernel = UniquePtr<float[]>(new float[kernel_size.x * kernel_size.y]());

	operation = _operation;
	return true;
}